

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MoiraExec_cpp.h
# Opt level: O0

void __thiscall
moira::Moira::execDbcc<(moira::Instr)52,(moira::Mode)12,(moira::Size)2>(Moira *this,u16 opcode)

{
  bool bVar1;
  uint addr;
  u32 addr_00;
  u32 uVar2;
  ushort in_SI;
  Moira *in_RDI;
  AEStackFrame frame;
  bool takeBranch;
  u32 newpc;
  int dn;
  u32 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  undefined1 in_stack_ffffffffffffffd8 [16];
  Moira *this_00;
  
  (*in_RDI->_vptr_Moira[0x19])(in_RDI,2);
  bVar1 = cond<(moira::Instr)52>(in_RDI);
  this_00 = in_stack_ffffffffffffffd8._8_8_;
  if (bVar1) {
    (*in_RDI->_vptr_Moira[0x19])(in_RDI,2);
  }
  else {
    addr = in_SI & 7;
    addr_00 = (in_RDI->reg).pc + (int)(short)(in_RDI->queue).irc;
    uVar2 = readD<(moira::Size)2>(in_RDI,in_stack_ffffffffffffffcc);
    bVar1 = misaligned<(moira::Size)2>(in_RDI,addr_00);
    this_00 = in_stack_ffffffffffffffd8._8_8_;
    if (bVar1) {
      frame = makeFrame<0ul>(this_00,in_stack_ffffffffffffffd8._4_4_,in_stack_ffffffffffffffd8._0_4_
                            );
      execAddressError(in_RDI,frame,in_stack_ffffffffffffffcc);
      return;
    }
    readD<(moira::Size)2>(in_RDI,addr);
    writeD<(moira::Size)2>(in_RDI,addr,in_stack_ffffffffffffffc8);
    if (uVar2 != 0) {
      (in_RDI->reg).pc = addr_00;
      fullPrefetch<4ul,0>(this_00);
      return;
    }
    readM<(moira::MemSpace)2,(moira::Size)2,0ul>(in_RDI,addr);
  }
  (in_RDI->reg).pc = (in_RDI->reg).pc + 2;
  fullPrefetch<4ul,0>(this_00);
  return;
}

Assistant:

void
Moira::execDbcc(u16 opcode)
{
    sync(2);
    if (!cond<I>()) {

        int dn = _____________xxx(opcode);
        u32 newpc = reg.pc + (i16)queue.irc;

        bool takeBranch = readD<Word>(dn) != 0;
        
        // Check for address error
        if (misaligned<S>(newpc)) {
            execAddressError(makeFrame(newpc, newpc + 2));
            return;
        }
        
        // Decrement loop counter
        writeD<Word>(dn, readD<Word>(dn) - 1);

        // Branch
        if (takeBranch) {
            reg.pc = newpc;
            fullPrefetch<POLLIPL>();
            return;
        } else {
            (void)readM<MEM_PROG, Word>(reg.pc + 2);
        }
    } else {
        sync(2);
    }

    // Fall through to next instruction
    reg.pc += 2;
    fullPrefetch<POLLIPL>();
}